

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
VerifyMark(HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>::VerifyMark()::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>::VerifyMark()::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,0);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyMark()
{
    HeapBlockList::ForEach(this->fullBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->VerifyMark();
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(this->sweepableHeapBlockList, [](TBlockType * heapBlock)
        {
            heapBlock->VerifyMark();
        });
    }
#endif

    HeapBlockList::ForEach(this->heapBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->VerifyMark();
    });
}